

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O1

void __thiscall llvm::yaml::Output::postflightKey(Output *this,void *param_1)

{
  int iVar1;
  ulong uVar2;
  InState *Elt;
  InState local_10 [2];
  
  uVar2 = (ulong)(this->StateStack).super_SmallVectorImpl<llvm::yaml::Output::InState>.
                 super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
                 super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.
                 super_SmallVectorBase.Size;
  if (uVar2 == 0) {
    __assert_fail("!empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                  ,0xa7,
                  "reference llvm::SmallVectorTemplateCommon<llvm::yaml::Output::InState>::back() [T = llvm::yaml::Output::InState]"
                 );
  }
  iVar1 = *(int *)((long)(this->StateStack).super_SmallVectorImpl<llvm::yaml::Output::InState>.
                         super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
                         super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.
                         super_SmallVectorBase.BeginX + uVar2 * 4 + -4);
  if (iVar1 == 6) {
    if ((ulong)(this->StateStack).super_SmallVectorImpl<llvm::yaml::Output::InState>.
               super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
               super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.
               super_SmallVectorBase.Capacity < uVar2 - 1) goto LAB_00dc61ae;
    (this->StateStack).super_SmallVectorImpl<llvm::yaml::Output::InState>.
    super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
    super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.super_SmallVectorBase.Size =
         (uint)(uVar2 - 1);
    Elt = local_10 + 1;
    local_10[1] = 7;
  }
  else {
    if (iVar1 != 4) {
      return;
    }
    if ((ulong)(this->StateStack).super_SmallVectorImpl<llvm::yaml::Output::InState>.
               super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
               super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.
               super_SmallVectorBase.Capacity < uVar2 - 1) {
LAB_00dc61ae:
      __assert_fail("N <= capacity()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                    ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
    }
    (this->StateStack).super_SmallVectorImpl<llvm::yaml::Output::InState>.
    super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
    super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.super_SmallVectorBase.Size =
         (uint)(uVar2 - 1);
    Elt = local_10;
    local_10[0] = inMapOtherKey;
  }
  SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>::push_back
            ((SmallVectorTemplateBase<llvm::yaml::Output::InState,_true> *)&this->StateStack,Elt);
  return;
}

Assistant:

void Output::postflightKey(void *) {
  if (StateStack.back() == inMapFirstKey) {
    StateStack.pop_back();
    StateStack.push_back(inMapOtherKey);
  } else if (StateStack.back() == inFlowMapFirstKey) {
    StateStack.pop_back();
    StateStack.push_back(inFlowMapOtherKey);
  }
}